

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1508.c
# Opt level: O2

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    lVar4 = curl_multi_init();
    iVar2 = 0;
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1508.c"
                    ,0x25);
      iVar2 = 0x7b;
    }
    curl_multi_cleanup(lVar4);
    curl_global_cleanup();
    curl_mprintf("We are done\n");
  }
  else {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1508.c"
                  ,0x23,iVar2,uVar3);
  }
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURLM *m = NULL;

  (void)URL;

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

test_cleanup:

  /* proper cleanup sequence - type PB */

  curl_multi_cleanup(m);
  curl_global_cleanup();

  printf("We are done\n");

  return res;
}